

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_generate.cc
# Opt level: O1

vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *
__thiscall
IncrementalEditDistance::all_next
          (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
           *__return_storage_ptr__,IncrementalEditDistance *this)

{
  pointer *pppVar1;
  byte bVar2;
  iterator __position;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  pair<unsigned_int,_float> local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar5 = -0x1d;
  do {
    local_28.second = 1.0;
    local_28.first = (int)lVar5 + 0x1e;
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>::
      _M_realloc_insert<std::pair<unsigned_int,float>>
                ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                  *)__return_storage_ptr__,__position,&local_28);
    }
    else {
      *__position._M_current = local_28;
      pppVar1 = &(__return_storage_ptr__->
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + 1;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0);
  fVar6 = (float)(this->prev_row[this->N] - this->prev_row_min);
  fVar7 = 100.0;
  if (fVar6 <= 100.0) {
    fVar7 = fVar6;
  }
  ((__return_storage_ptr__->
   super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
   )._M_impl.super__Vector_impl_data._M_start)->second = fVar7;
  if (this->N != 0) {
    uVar3 = 0;
    do {
      if (this->prev_row[uVar3] == this->prev_row_min) {
        bVar2 = (this->target)._M_dataplus._M_p[uVar3];
        if (bVar2 == 0x24) {
          uVar4 = 0;
        }
        else if (bVar2 == 0x20) {
          uVar4 = 1;
        }
        else {
          uVar4 = 0x1c;
          if ((byte)(bVar2 + 0x9f) < 0x1a) {
            uVar4 = (ulong)(bVar2 + 0x21 & 0x3f);
          }
        }
        (__return_storage_ptr__->
        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
        )._M_impl.super__Vector_impl_data._M_start[uVar4].second = 0.0;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->N);
  }
  return __return_storage_ptr__;
}

Assistant:

vector< pair<action,float> > all_next()
  { vector< pair<action,float> > B;
    for (size_t a=1; a<=29; a++)
      B.push_back( make_pair(a, 1.) );
    B[ char2action('$')-1 ].second = minf(100., (float)(prev_row[N] - prev_row_min));
    for (size_t n=0; n<N; n++)
      if (prev_row[n] == prev_row_min)
        B[ char2action(target[n])-1 ].second = 0.;
    return B;
  }